

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O0

PVIP_BOOL PVIP_string_concat_number(PVIPString *str,double n)

{
  PVIP_BOOL PVar1;
  int local_41c;
  char local_418 [4];
  int res;
  char buf [1024];
  double n_local;
  PVIPString *str_local;
  
  buf._1016_8_ = n;
  local_41c = snprintf(local_418,0x400,"%f",n);
  while ((1 < local_41c && (local_418[local_41c + -1] == '0'))) {
    local_41c = local_41c + -1;
  }
  PVar1 = PVIP_string_concat(str,local_418,(long)local_41c);
  return PVar1;
}

Assistant:

PVIP_BOOL PVIP_string_concat_number(PVIPString *str, double n) {
    char buf[1024];
    int res = snprintf(buf, sizeof(buf), "%f", n);
    for (; res>1; --res) { /* remove trailing zeros */
        if (buf[res-1]!='0') {
            break;
        }
    }
    return PVIP_string_concat(str, buf, res);
}